

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int8_suite::test_array8_int8_one(void)

{
  value_type expected [1];
  value_type input [3];
  decoder decoder;
  undefined1 local_65;
  value local_64;
  uchar local_60 [4];
  undefined4 local_5c;
  decoder local_58;
  
  local_60[2] = '\x12';
  local_60[0] = 0xa8;
  local_60[1] = '\x01';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[3]>
            (&local_58,(uchar (*) [3])local_60);
  local_64 = local_58.current.code;
  local_5c = 0xa8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array8_int8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x561,"void compact_int8_suite::test_array8_int8_one()",&local_64,&local_5c);
  local_65 = 0x12;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x567,"void compact_int8_suite::test_array8_int8_one()",local_58.current.view._M_str,
             local_58.current.view._M_str + local_58.current.view._M_len,&local_65,&local_64);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_64 = local_58.current.code;
  local_5c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x569,"void compact_int8_suite::test_array8_int8_one()",&local_64,&local_5c);
  return;
}

Assistant:

void test_array8_int8_one()
{
    const value_type input[] = { token::code::array8_int8, 0x01, 0x12 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array8_int8);
    const value_type expected[] = {
        0x12
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}